

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc.c
# Opt level: O2

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double damp;
  double dVar16;
  double dVar17;
  double adStack_40 [3];
  
  lVar5 = (long)(m + 1);
  pdVar2 = (double *)((long)adStack_40 + (8 - (lVar5 * 8 + 0xfU & 0xfffffffffffffff0)));
  pdVar12 = (double *)((long)pdVar2 - ((long)m * 8 + 0xfU & 0xfffffffffffffff0));
  pdVar12[-1] = 1.97626258336499e-323;
  lVar7 = (long)pdVar12[-1] + lVar5 * -4;
  iVar8 = m;
  while (bVar14 = lVar5 != 0, lVar5 = lVar5 + -1, bVar14) {
    dVar15 = 0.0;
    for (lVar9 = (long)iVar8; lVar9 < n; lVar9 = lVar9 + 1) {
      dVar15 = dVar15 + (double)*(float *)((long)data + lVar9 * 4 + lVar7) * (double)data[lVar9];
    }
    pdVar2[lVar5] = dVar15;
    iVar8 = iVar8 + -1;
    lVar7 = lVar7 + 4;
  }
  dVar15 = *pdVar2;
  dVar17 = dVar15 * 1.0000000001;
  uVar13 = 0;
  if (0 < m) {
    uVar13 = (ulong)(uint)m;
  }
  pdVar4 = pdVar12 + -1;
  uVar3 = 0;
  do {
    if (uVar3 == uVar13) {
LAB_00589747:
      dVar15 = 0.99;
      for (uVar3 = 0; uVar13 != uVar3; uVar3 = uVar3 + 1) {
        pdVar12[uVar3] = pdVar12[uVar3] * dVar15;
        dVar15 = dVar15 * 0.99;
      }
      for (uVar3 = 0; uVar13 != uVar3; uVar3 = uVar3 + 1) {
        lpci[uVar3] = (float)pdVar12[uVar3];
      }
      return (float)dVar17;
    }
    if (dVar17 < dVar15 * 1e-09 + 1e-10) {
      adStack_40[2] = dVar17;
      pdVar12[-1] = 2.86849079253323e-317;
      memset(pdVar12 + (uVar3 & 0xffffffff),0,(long)(m - (int)uVar3) << 3);
      dVar17 = adStack_40[2];
      goto LAB_00589747;
    }
    dVar16 = -pdVar2[uVar3 + 1];
    pdVar10 = pdVar12;
    uVar11 = uVar3;
    while (uVar11 != 0) {
      dVar16 = dVar16 - pdVar2[uVar11] * *pdVar10;
      pdVar10 = pdVar10 + 1;
      uVar11 = uVar11 - 1;
    }
    dVar16 = dVar16 / dVar17;
    pdVar12[uVar3] = dVar16;
    uVar6 = (uint)(uVar3 >> 1) & 0x7fffffff;
    pdVar10 = pdVar12;
    for (lVar5 = 0; -lVar5 != uVar3 >> 1; lVar5 = lVar5 + -1) {
      dVar1 = *pdVar10;
      *pdVar10 = pdVar4[lVar5] * dVar16 + dVar1;
      pdVar4[lVar5] = dVar1 * dVar16 + pdVar4[lVar5];
      pdVar10 = pdVar10 + 1;
    }
    if ((uVar3 & 1) != 0) {
      pdVar12[uVar6] = pdVar12[uVar6] * dVar16 + pdVar12[uVar6];
    }
    dVar17 = dVar17 * (1.0 - dVar16 * dVar16);
    pdVar4 = pdVar4 + 1;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

float vorbis_lpc_from_data(float *data,float *lpci,int n,int m){
  double *aut=alloca(sizeof(*aut)*(m+1));
  double *lpc=alloca(sizeof(*lpc)*(m));
  double error;
  double epsilon;
  int i,j;

  /* autocorrelation, p+1 lag coefficients */
  j=m+1;
  while(j--){
    double d=0; /* double needed for accumulator depth */
    for(i=j;i<n;i++)d+=(double)data[i]*data[(i-j)];
    aut[j]=d;
  }

  /* Generate lpc coefficients from autocorr values */

  /* set our noise floor to about -100dB */
  error=aut[0] * (1. + 1e-10);
  epsilon=1e-9*aut[0]+1e-10;

  for(i=0;i<m;i++){
    double r= -aut[i+1];

    if(error<epsilon){
      memset(lpc+i,0,(m-i)*sizeof(*lpc));
      goto done;
    }

    /* Sum up this iteration's reflection coefficient; note that in
       Vorbis we don't save it.  If anyone wants to recycle this code
       and needs reflection coefficients, save the results of 'r' from
       each iteration. */

    for(j=0;j<i;j++)r-=lpc[j]*aut[i-j];
    r/=error;

    /* Update LPC coefficients and total error */

    lpc[i]=r;
    for(j=0;j<i/2;j++){
      double tmp=lpc[j];

      lpc[j]+=r*lpc[i-1-j];
      lpc[i-1-j]+=r*tmp;
    }
    if(i&1)lpc[j]+=lpc[j]*r;

    error*=1.-r*r;

  }

 done:

  /* slightly damp the filter */
  {
    double g = .99;
    double damp = g;
    for(j=0;j<m;j++){
      lpc[j]*=damp;
      damp*=g;
    }
  }

  for(j=0;j<m;j++)lpci[j]=(float)lpc[j];

  /* we need the error value to know how big an impulse to hit the
     filter with later */

  return (float)error;
}